

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralConnection::~IfcStructuralConnection
          (IfcStructuralConnection *this)

{
  *(undefined8 *)&this[-1].field_0x38 = 0x7f5838;
  *(undefined8 *)&this->field_0x20 = 0x7f58b0;
  *(undefined8 *)&this[-1].field_0xc0 = 0x7f5860;
  *(undefined8 *)&this[-1].field_0xd0 = 0x7f5888;
  if (*(undefined1 **)&this[-1].field_0xe0 != &this[-1].field_0xf0) {
    operator_delete(*(undefined1 **)&this[-1].field_0xe0,*(long *)&this[-1].field_0xf0 + 1);
  }
  *(undefined8 *)&this[-1].field_0x38 = 0x7f5950;
  *(undefined8 *)&this->field_0x20 = 0x7f5978;
  if (*(undefined1 **)&this[-1].field_0x98 != &this[-1].field_0xa8) {
    operator_delete(*(undefined1 **)&this[-1].field_0x98,*(long *)&this[-1].field_0xa8 + 1);
  }
  if (*(undefined1 **)&this[-1].field_0x70 != &this[-1].field_0x80) {
    operator_delete(*(undefined1 **)&this[-1].field_0x70,*(long *)&this[-1].field_0x80 + 1);
  }
  if (*(undefined1 **)&this[-1].field_0x48 != &this[-1].field_0x58) {
    operator_delete(*(undefined1 **)&this[-1].field_0x48,*(long *)&this[-1].field_0x58 + 1);
  }
  operator_delete(&this[-1].field_0x38,0x148);
  return;
}

Assistant:

IfcStructuralConnection() : Object("IfcStructuralConnection") {}